

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_stdin.c
# Opt level: O1

int main(void)

{
  size_t __n;
  size_t sVar1;
  char buf [1024];
  undefined1 auStack_438 [1032];
  
  while ((__n = fread(auStack_438,1,0x400,_stdin), __n == 0 ||
         (sVar1 = fwrite(auStack_438,1,__n,_stdout), sVar1 == __n))) {
    if (__n != 0x400) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int main(void)
{
  char buf[1024];
  size_t nIn = sizeof(buf);
  while (nIn == sizeof(buf)) {
    nIn = fread(buf, 1, sizeof(buf), stdin);
    if (nIn > 0) {
      size_t nOut;
      nOut = fwrite(buf, 1, nIn, stdout);
      if (nOut != nIn) {
        return 1;
      }
    }
  }
  return 0;
}